

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * Catch::runTests(Totals *__return_storage_ptr__,Ptr<Catch::Config> *config)

{
  size_t *psVar1;
  TestCase *pTVar2;
  Ptr<const_Catch::IConfig> PVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  TestSpecParser *this;
  IRegistryHub *pIVar7;
  undefined4 extraout_var_00;
  long *plVar8;
  TestCase *testCase;
  Ptr<const_Catch::IConfig> iconfig;
  Ptr<Catch::IStreamingReporter> reporter;
  TestSpec testSpec;
  RunContext context;
  Ptr<const_Catch::IConfig> local_358;
  Ptr<Catch::IStreamingReporter> local_350;
  Ptr<Catch::IStreamingReporter> local_348;
  TestSpec local_340;
  string local_328;
  undefined1 local_308 [32];
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  pointer local_2d0;
  pointer puStack_2c8;
  pointer local_2c0;
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  vStack_2b8;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_2a0;
  TagAliasRegistry *local_288;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_280;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_268;
  RunContext local_248;
  
  local_358.m_p = (IConfig *)config->m_p;
  if ((Config *)local_358.m_p != (Config *)0x0) {
    (*(((Config *)local_358.m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  makeReporter((Catch *)&local_350,config);
  local_348.m_p = local_350.m_p;
  if (local_350.m_p != (IStreamingReporter *)0x0) {
    (*((local_350.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  addListeners((Catch *)&local_248,&local_358,&local_348);
  Ptr<Catch::IStreamingReporter>::operator=(&local_350,(Ptr<Catch::IStreamingReporter> *)&local_248)
  ;
  if (local_248.super_IResultCapture._vptr_IResultCapture != (_func_int **)0x0) {
    (**(code **)(*local_248.super_IResultCapture._vptr_IResultCapture + 0x18))();
  }
  if (local_348.m_p != (IStreamingReporter *)0x0) {
    (*((local_348.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  RunContext::RunContext(&local_248,&local_358,&local_350);
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  (__return_storage_ptr__->assertions).failedButOk = 0;
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[6])(local_308);
  RunContext::testGroupStarting(&local_248,(string *)local_308,1,1);
  if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  iVar6 = (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_340.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar6));
  if (local_340.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_340.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    TagAliasRegistry::get();
    local_2e8 = 0;
    local_2e0._M_local_buf[0] = '\0';
    local_2d0 = (pointer)0x0;
    puStack_2c8 = (pointer)0x0;
    local_2c0 = (pointer)0x0;
    vStack_2b8.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_2b8.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_2b8.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288 = &TagAliasRegistry::get::instance;
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    local_308._24_8_ = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"~[.]","");
    this = TestSpecParser::parse((TestSpecParser *)local_308,&local_328);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              (&local_280,&(this->m_testSpec).m_filters);
    local_268.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_340.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_268.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_340.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_268.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_340.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_340.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_280.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_340.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_280.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_340.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_280.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_280.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_280.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_280.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_268);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_2a0);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector(&vStack_2b8);
    if (local_2d0 != (pointer)0x0) {
      operator_delete(local_2d0,(long)local_2c0 - (long)local_2d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._24_8_ != &local_2e0) {
      operator_delete((void *)local_308._24_8_,
                      CONCAT71(local_2e0._M_allocated_capacity._1_7_,local_2e0._M_local_buf[0]) + 1)
      ;
    }
  }
  PVar3.m_p = local_358.m_p;
  pIVar7 = getRegistryHub();
  iVar6 = (*pIVar7->_vptr_IRegistryHub[3])(pIVar7);
  plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x18))
                             ((long *)CONCAT44(extraout_var_00,iVar6),PVar3.m_p);
  testCase = (TestCase *)*plVar8;
  pTVar2 = (TestCase *)plVar8[1];
  if (testCase != pTVar2) {
    do {
      sVar4 = local_248.m_totals.assertions.failed;
      iVar6 = (*((local_248.m_config.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])()
      ;
      PVar3.m_p = local_358.m_p;
      if (sVar4 == (long)iVar6) {
LAB_00130a88:
        (*((local_350.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
                  (local_350.m_p,testCase);
      }
      else {
        bVar5 = TestSpec::matches(&local_340,&testCase->super_TestCaseInfo);
        if (!bVar5) goto LAB_00130a88;
        iVar6 = (*(((SharedImpl<Catch::IConfig> *)&(PVar3.m_p)->super_IShared)->super_IConfig).
                  super_IShared.super_NonCopyable._vptr_NonCopyable[4])(PVar3.m_p);
        if (((char)iVar6 == '\0') && (((testCase->super_TestCaseInfo).properties & Throws) != None))
        goto LAB_00130a88;
        RunContext::runTest((Totals *)local_308,&local_248,testCase);
        (__return_storage_ptr__->assertions).passed =
             (size_t)(local_308._0_8_ + (__return_storage_ptr__->assertions).passed);
        psVar1 = &(__return_storage_ptr__->assertions).failed;
        *psVar1 = *psVar1 + local_308._8_8_;
        psVar1 = &(__return_storage_ptr__->assertions).failedButOk;
        *psVar1 = *psVar1 + local_308._16_8_;
        (__return_storage_ptr__->testCases).passed =
             (size_t)((__return_storage_ptr__->testCases).passed + local_308._24_8_);
        psVar1 = &(__return_storage_ptr__->testCases).failed;
        *psVar1 = *psVar1 + local_2e8;
        psVar1 = &(__return_storage_ptr__->testCases).failedButOk;
        *psVar1 = *psVar1 + CONCAT71(local_2e0._M_allocated_capacity._1_7_,local_2e0._M_local_buf[0]
                                    );
      }
      testCase = testCase + 1;
    } while (testCase != pTVar2);
  }
  (*(((SharedImpl<Catch::IConfig> *)&(local_358.m_p)->super_IShared)->super_IConfig).super_IShared.
    super_NonCopyable._vptr_NonCopyable[6])(local_308);
  RunContext::testGroupEnded(&local_248,(string *)local_308,__return_storage_ptr__,1,1);
  if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_340.m_filters);
  RunContext::~RunContext(&local_248);
  if (local_350.m_p != (IStreamingReporter *)0x0) {
    (*((local_350.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  if ((Config *)local_358.m_p != (Config *)0x0) {
    (*(((SharedImpl<Catch::IConfig> *)&(local_358.m_p)->super_IShared)->super_IConfig).super_IShared
      .super_NonCopyable._vptr_NonCopyable[3])();
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTests( Ptr<Config> const& config ) {

        Ptr<IConfig const> iconfig = config.get();

        Ptr<IStreamingReporter> reporter = makeReporter( config );
        reporter = addListeners( iconfig, reporter );

        RunContext context( iconfig, reporter );

        Totals totals;

        context.testGroupStarting( config->name(), 1, 1 );

        TestSpec testSpec = config->testSpec();
        if( !testSpec.hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

        std::vector<TestCase> const& allTestCases = getAllTestCasesSorted( *iconfig );
        for( std::vector<TestCase>::const_iterator it = allTestCases.begin(), itEnd = allTestCases.end();
                it != itEnd;
                ++it ) {
            if( !context.aborting() && matchTest( *it, testSpec, *iconfig ) )
                totals += context.runTest( *it );
            else
                reporter->skipTest( *it );
        }

        context.testGroupEnded( iconfig->name(), totals, 1, 1 );
        return totals;
    }